

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

JsonParse * jsonParseCached(sqlite3_context *pCtx,sqlite3_value **argv,sqlite3_context *pErrCtx)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  void *__s2;
  AuxData *pAVar5;
  JsonParse *pJVar6;
  AuxData *pAVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  JsonParse *pJVar11;
  
  __s2 = sqlite3ValueText(*argv,'\x01');
  iVar1 = sqlite3ValueBytes(*argv,'\x01');
  uVar8 = 0;
  if (__s2 != (void *)0x0) {
    pAVar7 = pCtx->pVdbe->pAuxData;
    uVar9 = 0xffffffff;
    iVar4 = 0;
    iVar10 = 0;
    pJVar6 = (JsonParse *)0x0;
    do {
      if (pAVar7 == (AuxData *)0x0) {
        iVar2 = 0;
        uVar8 = 0;
        goto LAB_001a11b5;
      }
      pAVar5 = pAVar7;
      while (iVar2 = iVar10, pAVar5->iAuxArg != iVar10 + -0x68f72) {
        pAVar5 = pAVar5->pNextAux;
        if (pAVar5 == (AuxData *)0x0) goto LAB_001a119a;
      }
      pJVar11 = (JsonParse *)pAVar5->pAux;
      if (pJVar11 == (JsonParse *)0x0) break;
      if (((pJVar6 == (JsonParse *)0x0) && (pJVar11->nJson == iVar1)) &&
         (iVar2 = bcmp(pJVar11->zJson,__s2,(long)iVar1), iVar2 == 0)) {
        pJVar11->nErr = '\0';
        uVar3 = pJVar11->iHold;
      }
      else {
        uVar3 = pJVar11->iHold;
        pJVar11 = pJVar6;
        if (uVar3 < uVar9) {
          uVar9 = uVar3;
          iVar4 = iVar10;
        }
      }
      if (uVar8 < uVar3) {
        uVar8 = uVar3;
      }
      iVar10 = iVar10 + 1;
      pJVar6 = pJVar11;
      iVar2 = iVar4;
    } while (iVar10 != 4);
LAB_001a119a:
    if (pJVar6 != (JsonParse *)0x0) {
      pJVar6->nErr = '\0';
      pJVar6->iHold = uVar8 + 1;
      return pJVar6;
    }
LAB_001a11b5:
    iVar4 = sqlite3_initialize();
    if ((iVar4 == 0) &&
       (pJVar6 = (JsonParse *)sqlite3Malloc((long)iVar1 + 0x31), pJVar6 != (JsonParse *)0x0)) {
      pJVar6->zJson = (char *)0x0;
      pJVar6->aUp = (u32 *)0x0;
      pJVar6->oom = '\0';
      pJVar6->nErr = '\0';
      pJVar6->iDepth = 0;
      pJVar6->nJson = 0;
      *(undefined8 *)&pJVar6->iHold = 0;
      pJVar6->nNode = 0;
      pJVar6->nAlloc = 0;
      pJVar6->aNode = (JsonNode *)0x0;
      pJVar11 = pJVar6 + 1;
      pJVar6->zJson = (char *)pJVar11;
      memcpy(pJVar11,__s2,(long)(iVar1 + 1));
      iVar4 = jsonParse(pJVar6,pErrCtx,(char *)pJVar11);
      if (iVar4 == 0) {
        pJVar6->nJson = iVar1;
        pJVar6->iHold = uVar8 + 1;
        sqlite3_set_auxdata(pCtx,iVar2 + -0x68f72,pJVar6,jsonParseFree);
        pAVar7 = pCtx->pVdbe->pAuxData;
        if (pAVar7 != (AuxData *)0x0) {
          while ((pAVar7->iAuxArg != iVar2 + -0x68f72 ||
                 ((0x68f71 < iVar2 && (pAVar7->iAuxOp != pCtx->iOp))))) {
            pAVar7 = pAVar7->pNextAux;
            if (pAVar7 == (AuxData *)0x0) {
              return (JsonParse *)0x0;
            }
          }
          return (JsonParse *)pAVar7->pAux;
        }
      }
      else {
        sqlite3_free(pJVar6);
      }
    }
    else {
      sqlite3_result_error_nomem(pCtx);
    }
  }
  return (JsonParse *)0x0;
}

Assistant:

static JsonParse *jsonParseCached(
  sqlite3_context *pCtx,
  sqlite3_value **argv,
  sqlite3_context *pErrCtx
){
  const char *zJson = (const char*)sqlite3_value_text(argv[0]);
  int nJson = sqlite3_value_bytes(argv[0]);
  JsonParse *p;
  JsonParse *pMatch = 0;
  int iKey;
  int iMinKey = 0;
  u32 iMinHold = 0xffffffff;
  u32 iMaxHold = 0;
  if( zJson==0 ) return 0;
  for(iKey=0; iKey<JSON_CACHE_SZ; iKey++){
    p = (JsonParse*)sqlite3_get_auxdata(pCtx, JSON_CACHE_ID+iKey);
    if( p==0 ){
      iMinKey = iKey;
      break;
    }
    if( pMatch==0
     && p->nJson==nJson
     && memcmp(p->zJson,zJson,nJson)==0
    ){
      p->nErr = 0;
      pMatch = p;
    }else if( p->iHold<iMinHold ){
      iMinHold = p->iHold;
      iMinKey = iKey;
    }
    if( p->iHold>iMaxHold ){
      iMaxHold = p->iHold;
    }
  }
  if( pMatch ){
    pMatch->nErr = 0;
    pMatch->iHold = iMaxHold+1;
    return pMatch;
  }
  p = sqlite3_malloc64( sizeof(*p) + nJson + 1 );
  if( p==0 ){
    sqlite3_result_error_nomem(pCtx);
    return 0;
  }
  memset(p, 0, sizeof(*p));
  p->zJson = (char*)&p[1];
  memcpy((char*)p->zJson, zJson, nJson+1);
  if( jsonParse(p, pErrCtx, p->zJson) ){
    sqlite3_free(p);
    return 0;
  }
  p->nJson = nJson;
  p->iHold = iMaxHold+1;
  sqlite3_set_auxdata(pCtx, JSON_CACHE_ID+iMinKey, p,
                      (void(*)(void*))jsonParseFree);
  return (JsonParse*)sqlite3_get_auxdata(pCtx, JSON_CACHE_ID+iMinKey);
}